

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

void __thiscall NaPetriNet::terminate(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  NaPetriConnector *pNVar5;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  sigaction sa_old;
  sigaction sa;
  sigaction local_160;
  _union_1457 local_c8 [19];
  
  bVar6 = bDoPrintouts | this->bTermPrintout;
  if (bVar6 == 1) {
    NaPrintLog("# net \'%s\', obtain statistics:\n",this->szName);
    if (0 < (this->pnaNet).nItems) {
      pNVar1 = &this->pnaNet;
      uVar7 = 0;
      do {
        iVar2 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,uVar7);
        pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var,iVar2));
        iVar2 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,uVar7);
        uVar8 = *(uint *)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x3c);
        iVar2 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,uVar7);
        NaPrintLog(" * node \'%s\' was called %u times and %u times was activated.\n",pcVar4,
                   (ulong)uVar8,(ulong)*(uint *)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x40));
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
      } while ((int)uVar8 < (this->pnaNet).nItems);
    }
    NaPrintLog("# net \'%s\', phase #10: deallocation and closing data.\n",this->szName);
  }
  pNVar1 = &this->pnaNet;
  if (0 < (this->pnaNet).nItems) {
    uVar7 = 0;
    do {
      if (bVar6 != 0) {
        iVar2 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar7);
        pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar2));
        NaPrintLog("node \'%s\'\n",pcVar4);
      }
      iVar2 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar7);
      (**(code **)(**(long **)CONCAT44(extraout_var_03,iVar2) + 0xa0))();
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
    } while ((int)uVar8 < (this->pnaNet).nItems);
  }
  if (0 < (this->pnaNet).nItems) {
    uVar7 = 0;
    do {
      iVar2 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar7);
      iVar2 = NaPetriNode::connectors(*(NaPetriNode **)CONCAT44(extraout_var_04,iVar2));
      if (0 < iVar2) {
        iVar2 = 0;
        do {
          iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar7);
          pNVar5 = NaPetriNode::connector(*(NaPetriNode **)CONCAT44(extraout_var_05,iVar3),iVar2);
          (*pNVar5->_vptr_NaPetriConnector[6])(pNVar5);
          iVar2 = iVar2 + 1;
          iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar7);
          iVar3 = NaPetriNode::connectors(*(NaPetriNode **)CONCAT44(extraout_var_06,iVar3));
        } while (iVar2 < iVar3);
      }
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
    } while ((int)uVar8 < (this->pnaNet).nItems);
  }
  if (0 < (this->pnaNet).nItems) {
    uVar8 = 0;
    do {
      iVar2 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      *(undefined1 *)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x39) = 1;
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (this->pnaNet).nItems);
  }
  if (this->dfTimeChart != (NaDataFile *)0x0) {
    (*this->dfTimeChart->_vptr_NaDataFile[1])();
    this->dfTimeChart = (NaDataFile *)0x0;
  }
  local_c8[0].sa_handler = (__sighandler_t)0x0;
  sigaction(2,(sigaction *)local_c8,&local_160);
  sigaction(0xf,(sigaction *)local_c8,&local_160);
  sigaction(3,(sigaction *)local_c8,&local_160);
  if ((FILE *)this->fpMap != (FILE *)0x0) {
    fclose((FILE *)this->fpMap);
    this->fpMap = (FILE *)0x0;
  }
  return;
}

Assistant:

void
NaPetriNet::terminate (bool bDoPrintouts)
{
    int     iNode;

    if(bTermPrintout)
      bDoPrintouts = bTermPrintout;

    if(bDoPrintouts){
      // Get statistics from each node
      NaPrintLog("# net '%s', obtain statistics:\n", name());
      for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	NaPrintLog(" * node '%s' was called %u times and %u times "\
		   "was activated.\n",
		   pnaNet[iNode]->name(),
		   pnaNet[iNode]->nCalls,
		   pnaNet[iNode]->nActivations);
      }

      NaPrintLog("# net '%s', phase #10: deallocation and closing data.\n",
		 name());
    }

    // 10. Deallocate resources and close external data
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
		NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->release_and_close();
        }catch(NaException exCode){
            NaPrintLog("Deallocate resources phase (#10): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    // Call final() for each connector
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Need to shutdown connections
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
	  try{
            pnaNet[iNode]->connector(iCn)->final();
	  }catch(NaException exCode){
            NaPrintLog("Failure at %s.%s.%s.final().\n"
                       "Caused by exception: %s\n",
		       name(), pnaNet[iNode]->name(),
		       pnaNet[iNode]->connector(iCn)->name(),
		       NaExceptionMsg(exCode));
	  }
        }
    }

    // Allow changes of node parameters
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        pnaNet[iNode]->bTunable = true;
    }

    if(NULL != dfTimeChart){
        delete dfTimeChart;
        dfTimeChart = NULL;
    }

#if defined(unix)
    // Reset the signal handler
    struct sigaction	sa, sa_old;
    sa.sa_handler = SIG_DFL;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
#endif /* unix */

    /* Close activation map file */
    if(NULL != fpMap)
      {
	fclose(fpMap);
	fpMap = NULL;
      }
}